

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::destroyImagesIter(CopyImageTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  ObjectWrapper *pOVar3;
  State *pSVar4;
  undefined1 local_198 [384];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Deleting source image. ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  pOVar3 = this->m_state->srcImage;
  if (pOVar3 != (ObjectWrapper *)0x0) {
    glu::ObjectWrapper::~ObjectWrapper(pOVar3);
  }
  operator_delete(pOVar3,0x18);
  pSVar4 = this->m_state;
  pSVar4->srcImage = (ObjectWrapper *)0x0;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::clear(&pSVar4->srcImageLevels);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Deleting destination image. ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  pOVar3 = this->m_state->dstImage;
  if (pOVar3 != (ObjectWrapper *)0x0) {
    glu::ObjectWrapper::~ObjectWrapper(pOVar3);
  }
  operator_delete(pOVar3,0x18);
  pSVar4 = this->m_state;
  pSVar4->dstImage = (ObjectWrapper *)0x0;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::clear(&pSVar4->dstImageLevels);
  return;
}

Assistant:

void CopyImageTest::destroyImagesIter (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Deleting source image. " << TestLog::EndMessage;

	delete m_state->srcImage;
	m_state->srcImage = NULL;
	m_state->srcImageLevels.clear();

	log << TestLog::Message << "Deleting destination image. " << TestLog::EndMessage;

	delete m_state->dstImage;
	m_state->dstImage = NULL;
	m_state->dstImageLevels.clear();
}